

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

void __thiscall front::syntax::SyntaxAnalyze::gm_var_decl(SyntaxAnalyze *this)

{
  size_t sVar1;
  bool bVar2;
  pointer pWVar3;
  long lVar4;
  
  match_one_word(this,INTTK);
  gm_var_def(this);
  pWVar3 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->word_list->
                super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pWVar3;
  sVar1 = this->matched_index;
  while (sVar1 + 1 < (ulong)((lVar4 >> 4) * -0x5555555555555555)) {
    bVar2 = word::Word::match_token(pWVar3 + sVar1 + 1,COMMA);
    if (!bVar2) break;
    match_one_word(this,COMMA);
    gm_var_def(this);
    pWVar3 = (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(this->word_list->
                  super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl
                  .super__Vector_impl_data._M_finish - (long)pWVar3;
    sVar1 = this->matched_index;
  }
  match_one_word(this,SEMICN);
  return;
}

Assistant:

void SyntaxAnalyze::gm_var_decl() {
  match_one_word(Token::INTTK);
  gm_var_def();
  while (try_word(1, Token::COMMA)) {
    match_one_word(Token::COMMA);
    gm_var_def();
  }
  match_one_word(Token::SEMICN);
}